

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O1

void __thiscall
Assimp::COBImporter::ReadUnit_Ascii
          (COBImporter *this,Scene *out,LineSplitter *splitter,ChunkInfo *nfo)

{
  char cVar1;
  int *piVar2;
  _Elt_pointer psVar3;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  Logger *pLVar5;
  char *pcVar6;
  range_error *this_00;
  _Map_pointer ppsVar8;
  _Elt_pointer psVar9;
  ulong uVar10;
  _Elt_pointer psVar11;
  uint uVar12;
  bool bVar13;
  float fVar14;
  uint t;
  char *local_360;
  char local_350 [16];
  char *local_340;
  char local_330 [16];
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  undefined1 local_1a8 [376];
  char *pcVar7;
  
  if (1 < nfo->version) {
    UnsupportedChunk_Ascii(this,splitter,nfo,"Unit");
    return;
  }
  LineSplitter::operator++(splitter);
  if (((splitter->mCur)._M_string_length < 6) ||
     (piVar2 = (int *)(splitter->mCur)._M_dataplus._M_p,
     (short)piVar2[1] != 0x2073 || *piVar2 != 0x74696e55)) {
    pLVar5 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[39]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [39])"Expected `Units` line in `Unit` chunk ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar5,(char *)CONCAT44(local_320._4_4_,local_320._0_4_));
    if ((undefined1 *)CONCAT44(local_320._4_4_,local_320._0_4_) != &local_320.field_0x10) {
      operator_delete((undefined1 *)CONCAT44(local_320._4_4_,local_320._0_4_));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    pbVar4 = (basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8;
    goto LAB_0048e1af;
  }
  psVar11 = (out->nodes).
            super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  psVar3 = (out->nodes).
           super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  bVar13 = psVar11 == psVar3;
  if (!bVar13) {
    if ((((psVar11->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        super_ChunkInfo).id != nfo->parent_id) {
      psVar9 = (out->nodes).
               super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppsVar8 = (out->nodes).
                super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        psVar11 = psVar11 + 1;
        if (psVar11 == psVar9) {
          psVar11 = ppsVar8[1];
          ppsVar8 = ppsVar8 + 1;
          psVar9 = psVar11 + 0x20;
        }
        bVar13 = psVar11 == psVar3;
        if (bVar13) goto LAB_0048e36e;
      } while ((((psVar11->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                )->super_ChunkInfo).id != nfo->parent_id);
    }
    pcVar7 = (splitter->mCur)._M_dataplus._M_p;
    do {
      do {
        pcVar6 = pcVar7 + 1;
        cVar1 = *pcVar7;
        pcVar7 = pcVar6;
      } while (cVar1 == '\t');
    } while (cVar1 == ' ');
    do {
      uVar10 = (ulong)(byte)pcVar6[-1];
      if (uVar10 < 0x21) {
        if ((0x100000200U >> (uVar10 & 0x3f) & 1) != 0) goto LAB_0048e264;
        if ((0x3401UL >> (uVar10 & 0x3f) & 1) != 0) {
          this_00 = (range_error *)__cxa_allocate_exception(0x10);
          std::range_error::range_error(this_00,"Token index out of range, EOL reached");
          __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
        }
      }
      pcVar6 = pcVar6 + 1;
    } while( true );
  }
  goto LAB_0048e36e;
LAB_0048e264:
  for (; (cVar1 = pcVar6[-1], cVar1 == ' ' || (cVar1 == '\t')); pcVar6 = pcVar6 + 1) {
  }
  uVar12 = 0;
  if (0xf5 < (byte)(cVar1 - 0x3aU)) {
    uVar12 = 0;
    do {
      uVar12 = (uint)(byte)(cVar1 - 0x30) + uVar12 * 10;
      cVar1 = *pcVar6;
      pcVar6 = pcVar6 + 1;
    } while (0xf5 < (byte)(cVar1 - 0x3aU));
  }
  local_320._0_4_ = uVar12;
  if (uVar12 < 8) {
    fVar14 = units[uVar12];
  }
  else {
    pLVar5 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<unsigned_int>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (uint *)&local_320);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," is not a valid value for `Units` attribute in `Unit chunk` ",
               0x3c);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar5,local_340);
    fVar14 = 1.0;
  }
  ((psVar11->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->unit_scale
       = fVar14;
  if (7 < uVar12) {
    if (local_340 != local_330) {
      operator_delete(local_340);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  if (!bVar13) {
    return;
  }
LAB_0048e36e:
  pLVar5 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[14]>(&local_320,(char (*) [14])0x789a66);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320," is a child of ",0xf);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_320);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320," which does not exist",0x15);
  std::__cxx11::stringbuf::str();
  Logger::warn(pLVar5,local_360);
  if (local_360 != local_350) {
    operator_delete(local_360);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
  pbVar4 = &local_320;
LAB_0048e1af:
  std::ios_base::~ios_base((ios_base *)&pbVar4->field_0x70);
  return;
}

Assistant:

void COBImporter::ReadUnit_Ascii(Scene& out, LineSplitter& splitter, const ChunkInfo& nfo)
{
    if(nfo.version > 1) {
        return UnsupportedChunk_Ascii(splitter,nfo,"Unit");
    }
    ++splitter;
    if (!splitter.match_start("Units ")) {
        ASSIMP_LOG_WARN_F( "Expected `Units` line in `Unit` chunk ", nfo.id);
        return;
    }

    // parent chunks preceede their childs, so we should have the
    // corresponding chunk already.
    for(std::shared_ptr< Node >& nd : out.nodes) {
        if (nd->id == nfo.parent_id) {
            const unsigned int t=strtoul10(splitter[1]);

            nd->unit_scale = t>=sizeof(units)/sizeof(units[0])?(
                ASSIMP_LOG_WARN_F(t, " is not a valid value for `Units` attribute in `Unit chunk` ", nfo.id)
                ,1.f):units[t];
            return;
        }
    }
    ASSIMP_LOG_WARN_F( "`Unit` chunk ", nfo.id, " is a child of ", nfo.parent_id, " which does not exist");
}